

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall
Lowerer::GetValueFromIndirOpnd
          (Lowerer *this,IndirOpnd *indirOpnd,Opnd **pValueOpnd,IntConstType *pValue)

{
  RegOpnd *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  uint uVar4;
  undefined4 *puVar5;
  IntConstOpnd *pIVar6;
  ulong value;
  
  this_00 = indirOpnd->m_indexOpnd;
  if (this_00 == (RegOpnd *)0x0) {
    uVar4 = indirOpnd->m_offset;
  }
  else {
    bVar2 = StackSym::IsIntConst(this_00->m_sym);
    pIVar6 = (IntConstOpnd *)0x0;
    value = 0;
    if (!bVar2) goto LAB_005dca28;
    OVar3 = IR::Opnd::GetKind(&this_00->super_Opnd);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    uVar4 = StackSym::GetIntConstValue(this_00->m_sym);
  }
  if ((int)uVar4 < 0) {
    return false;
  }
  value = (ulong)uVar4;
  pIVar6 = IR::IntConstOpnd::New(value,TyInt32,this->m_func,false);
LAB_005dca28:
  *pValueOpnd = &pIVar6->super_Opnd;
  *pValue = value;
  return true;
}

Assistant:

bool
Lowerer::GetValueFromIndirOpnd(IR::IndirOpnd *indirOpnd, IR::Opnd **pValueOpnd, IntConstType *pValue)
{
    IR::RegOpnd *indexOpnd = indirOpnd->GetIndexOpnd();
    IR::Opnd* valueOpnd = nullptr;
    IntConstType value = 0;
    if (!indexOpnd)
    {
        value = (IntConstType)indirOpnd->GetOffset();
        if (value < 0)
        {
            // Can't do fast path for negative index
            return false;
        }
        valueOpnd = IR::IntConstOpnd::New(value, TyInt32, this->m_func);
    }
    else if (indexOpnd->m_sym->IsIntConst())
    {
        value = indexOpnd->AsRegOpnd()->m_sym->GetIntConstValue();
        if (value < 0)
        {
            // Can't do fast path for negative index
            return false;
        }
        valueOpnd = IR::IntConstOpnd::New(value, TyInt32, this->m_func);
    }
    *pValueOpnd = valueOpnd;
    *pValue = value;
    return true;
}